

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::BaseBuilder::_newLabelNode(BaseBuilder *this,LabelNode **out)

{
  Error EVar1;
  
  *out = (LabelNode *)0x0;
  EVar1 = _newNodeT<asmjit::LabelNode>(this,out);
  if (EVar1 != 0) {
    return EVar1;
  }
  EVar1 = registerLabelNode(this,*out);
  return EVar1;
}

Assistant:

Error BaseBuilder::_newLabelNode(LabelNode** out) {
  *out = nullptr;

  ASMJIT_PROPAGATE(_newNodeT<LabelNode>(out));
  return registerLabelNode(*out);
}